

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTTClient.cpp
# Opt level: O1

ErrorType __thiscall
Network::Client::MQTTv5::connectTo
          (MQTTv5 *this,char *serverHost,uint16 port,bool useTLS,uint16 keepAliveTimeInSec,
          bool cleanStart,char *userName,DynamicBinDataView *password,WillMessage *willMessage,
          QoSDelivery willQoS,bool willRetain,Properties *properties)

{
  Impl *pIVar1;
  PropertyBase *pPVar2;
  int iVar3;
  size_t sVar4;
  undefined6 in_register_00000012;
  byte bVar5;
  ErrorType EVar6;
  Property<unsigned_short> maxRecv;
  Property<unsigned_int> maxProp;
  ControlPacketSerializable local_1b0;
  undefined ***local_1a8;
  undefined **local_1a0;
  undefined1 local_198;
  undefined2 local_194;
  undefined ***local_190;
  Properties *local_188;
  undefined ***local_180;
  undefined **local_178;
  undefined1 local_170;
  undefined **local_168;
  undefined ***local_160;
  undefined4 local_158;
  undefined2 local_154;
  undefined4 local_152;
  undefined **local_148;
  undefined4 *local_140;
  Properties local_138;
  undefined **local_110;
  undefined **local_108;
  undefined **local_100;
  uint16 local_f8;
  char *local_f6;
  WillMessage *local_e8;
  undefined **local_e0;
  undefined **local_d8;
  undefined2 local_d0;
  char *local_ce;
  undefined **local_c6;
  undefined **local_be;
  undefined2 local_b6;
  undefined6 uStack_b4;
  undefined2 uStack_ae;
  undefined ***local_a8;
  PropertyBase local_a0;
  undefined ***local_80;
  undefined **local_78;
  ushort local_70;
  PropertyBase local_68;
  undefined ***local_48;
  undefined **local_40;
  uint32 local_38;
  
  EVar6.errorCode = 0xfffffffc;
  if ((int)CONCAT62(in_register_00000012,port) != 0 && serverHost != (char *)0x0) {
    pIVar1 = this->impl;
    local_38 = (pIVar1->super_ImplBase<Network::Client::MQTTv5::Impl>).buffers.size;
    local_48 = &local_40;
    local_68.type = '\'';
    local_68.next = (PropertyBase *)0x0;
    local_68.heapAllocated = false;
    local_68.super_Serializable._vptr_Serializable = (_func_int **)&PTR_getSize_00131e50;
    local_40 = &PTR_typeSize_00132188;
    local_70 = (pIVar1->super_ImplBase<Network::Client::MQTTv5::Impl>).buffers.maxID / 3;
    local_80 = &local_78;
    local_a0.type = '!';
    local_a0.next = (PropertyBase *)0x0;
    local_a0.heapAllocated = false;
    local_a0.super_Serializable._vptr_Serializable = (_func_int **)&PTR_getSize_001321d8;
    local_78 = &PTR_typeSize_00132238;
    local_1a8 = &local_178;
    local_190 = &local_168;
    local_180 = &local_110;
    local_1a0 = &PTR_getSize_00131a40;
    local_194 = 1;
    local_198 = 0;
    local_1b0.super_Serializable._vptr_Serializable = (Serializable)&PTR_getSize_00132278;
    local_170 = 0x10;
    local_178 = &PTR_getType_00132308;
    local_140 = &local_158;
    local_152 = 5;
    local_158 = Protocol::MQTT::V5::ConnectHeaderImpl::expectedProtocolName()::protocolName;
    local_154 = DAT_001333a4;
    local_160 = &local_148;
    local_168 = &PTR_getSize_00132340;
    local_148 = &PTR_typeSize_00132410;
    local_138.super_SerializableProperties.super_Serializable._vptr_Serializable =
         (Serializable)&PTR_getSize_00132450;
    local_138.length.super_Serializable._vptr_Serializable = (_func_int **)&PTR_getSize_00131a40;
    local_138.length.size = 1;
    local_138.length.field_0.word = local_138.length.field_0.word & 0xffffff00;
    local_138.head = (PropertyBase *)0x0;
    local_138.reference = (PropertyBase *)0x0;
    local_110 = &PTR_getSize_001324a8;
    local_108 = &PTR_getSize_00131a80;
    local_100 = &PTR_acceptBuffer_00131ab8;
    local_f8 = 0;
    local_f6 = (char *)0x0;
    local_e8 = (WillMessage *)0x0;
    local_e0 = &PTR_getSize_00131a80;
    local_d8 = &PTR_acceptBuffer_00131ab8;
    local_d0 = 0;
    local_ce = (char *)0x0;
    local_c6 = &PTR_getSize_00130f10;
    local_be = &PTR_acceptBuffer_00130f48;
    local_b6 = 0;
    uStack_b4 = 0;
    uStack_ae = 0;
    EVar6.errorCode = 0xfffffffd;
    local_188 = &local_138;
    local_a8 = local_190;
    if (pIVar1->socket == (BaseSocket *)0x0) {
      if (properties != (Properties *)0x0) {
        local_138.reference = properties->head;
        local_138.length.field_0 = (properties->length).field_0;
        local_138.length.size = (properties->length).size;
      }
      local_138.head = local_138.reference;
      if ((this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>).buffers.size < 0xfffffff) {
        Protocol::MQTT::V5::Properties::append(&local_138,&local_68);
      }
      if (2 < (this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>).buffers.maxID) {
        Protocol::MQTT::V5::Properties::append(&local_138,&local_a0);
      }
      iVar3 = Impl::connectWith(this->impl,serverHost,port,useTLS);
      if (iVar3 == 0) {
        pIVar1 = this->impl;
        (pIVar1->super_ImplBase<Network::Client::MQTTv5::Impl>).keepAlive =
             (uint16)((uint)(keepAliveTimeInSec >> 1) + (uint)keepAliveTimeInSec >> 1);
        bVar5 = local_152._1_1_ & 1;
        local_152 = CONCAT22(keepAliveTimeInSec,
                             CONCAT11((userName != (char *)0x0) << 7 | cleanStart * '\x02' |
                                      (password != (DynamicBinDataView *)0x0) << 6 |
                                      (willMessage != (WillMessage *)0x0) << 2 | willRetain << 5 |
                                      ((byte)willQoS & 3) << 3 | bVar5,(undefined1)local_152));
        local_f8 = (pIVar1->super_ImplBase<Network::Client::MQTTv5::Impl>).clientID.length;
        local_f6 = (pIVar1->super_ImplBase<Network::Client::MQTTv5::Impl>).clientID.data;
        if (willMessage != (WillMessage *)0x0) {
          local_e8 = willMessage;
        }
        if (userName != (char *)0x0) {
          sVar4 = strlen(userName);
          local_d0 = (undefined2)sVar4;
          local_ce = userName;
        }
        if (password != (DynamicBinDataView *)0x0) {
          uStack_ae = *(undefined2 *)((long)&password->data + 6);
          local_b6 = (undefined2)*(undefined8 *)&password->length;
          uStack_b4 = (undefined6)((ulong)*(undefined8 *)&password->length >> 0x10);
        }
        EVar6 = ImplBase<Network::Client::MQTTv5::Impl>::prepareSAR
                          (&pIVar1->super_ImplBase<Network::Client::MQTTv5::Impl>,&local_1b0,true,
                           false);
        pIVar1 = this->impl;
        if (EVar6.errorCode == 0) {
          if (((pIVar1->super_ImplBase<Network::Client::MQTTv5::Impl>).recvState ==
               GotCompletePacket) &&
             (((pIVar1->super_ImplBase<Network::Client::MQTTv5::Impl>).buffers.buffer
               [(ulong)(pIVar1->super_ImplBase<Network::Client::MQTTv5::Impl>).buffers.maxID * 4] &
              0xf0) == 0x20)) {
            EVar6.errorCode =
                 (int32)ImplBase<Network::Client::MQTTv5::Impl>::handleConnACK
                                  (&pIVar1->super_ImplBase<Network::Client::MQTTv5::Impl>);
            if (EVar6.errorCode != 0) {
              ImplBase<Network::Client::MQTTv5::Impl>::close
                        (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>,0x80);
            }
          }
          else {
            EVar6.errorCode = 0x82;
            ImplBase<Network::Client::MQTTv5::Impl>::close
                      (&pIVar1->super_ImplBase<Network::Client::MQTTv5::Impl>,0x80);
          }
        }
        else {
          ImplBase<Network::Client::MQTTv5::Impl>::close
                    (&pIVar1->super_ImplBase<Network::Client::MQTTv5::Impl>,0x80);
        }
      }
      else {
        ImplBase<Network::Client::MQTTv5::Impl>::close
                  (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>,0x80);
        EVar6.errorCode = (uint)(iVar3 == -7) << 2 | 0xfffffffa;
      }
    }
    if ((local_138.head != (PropertyBase *)0x0) && (local_138.head != local_138.reference)) {
      do {
        pPVar2 = (local_138.head)->next;
        if ((local_138.head)->heapAllocated == true) {
          (*((local_138.head)->super_Serializable)._vptr_Serializable[6])();
        }
      } while ((pPVar2 != (PropertyBase *)0x0) &&
              (local_138.head = pPVar2, pPVar2 != local_138.reference));
    }
  }
  return (ErrorType)EVar6.errorCode;
}

Assistant:

MQTTv5::ErrorType MQTTv5::connectTo(const char * serverHost, const uint16 port, bool useTLS, const uint16 keepAliveTimeInSec,
        const bool cleanStart, const char * userName, const DynamicBinDataView * password, WillMessage * willMessage, const QoSDelivery willQoS, const bool willRetain,
        Properties * properties)
    {
        if (serverHost == nullptr || !port)
            return ErrorType::BadParameter;

        // Please do not move the line below as it must outlive the packet
        Protocol::MQTT::V5::Property<uint32> maxProp(Protocol::MQTT::V5::PacketSizeMax, impl->buffers.size);
        Protocol::MQTT::V5::Property<uint16> maxRecv(Protocol::MQTT::V5::ReceiveMax, impl->buffers.packetsCount());
        Protocol::MQTT::V5::ControlPacket<Protocol::MQTT::V5::CONNECT> packet;

        if (impl->isOpen()) return ErrorType::AlreadyConnected;

        // Capture properties (to avoid copying them)
        packet.props.capture(properties);

        // Check if we have a max packet size property and if not, append one to let the server know our limitation (if any)
        if (impl->buffers.size < Protocol::MQTT::Common::VBInt::MaxPossibleSize)
            packet.props.append(&maxProp); // It'll fail silently if it already exists
        if (impl->buffers.packetsCount())
            packet.props.append(&maxRecv); // It'll fail silently if it already exists


#if MQTTAvoidValidation != 1
        if (!packet.props.checkPropertiesFor(Protocol::MQTT::V5::CONNECT))
            return ErrorType::BadProperties;
#endif

        // Check we can contact the server and connect to it (not initial write to the server is required here)
        if (int ret = impl->connectWith(serverHost, port, useTLS))
        {
            impl->close();
            return ret == -7 ? ErrorType::TimedOut : ErrorType::NetworkError;
        }

        // Create the header object now
        impl->keepAlive = (keepAliveTimeInSec + (keepAliveTimeInSec / 2)) / 2; // Make it 75% of what's given so we always wake up before doom's clock
        packet.fixedVariableHeader.keepAlive = keepAliveTimeInSec;
        packet.fixedVariableHeader.cleanStart = cleanStart ? 1 : 0;
        packet.fixedVariableHeader.willFlag = willMessage != nullptr ? 1 : 0;
        packet.fixedVariableHeader.willQoS = (uint8)willQoS;
        packet.fixedVariableHeader.willRetain = willRetain ? 1 : 0;
        packet.fixedVariableHeader.passwordFlag = password != nullptr ? 1 : 0;
        packet.fixedVariableHeader.usernameFlag = userName != nullptr ? 1 : 0;

        // And the payload too now
        packet.payload.clientID = impl->clientID;
        if (willMessage != nullptr) packet.payload.willMessage = willMessage;
        if (userName != nullptr)    packet.payload.username = userName;
        if (password != nullptr)    packet.payload.password = *password;

        // Ok, setting are done, let's build this packet now
        if (ErrorType ret = impl->prepareSAR(packet))
        {
            impl->close();
            return ret;
        }

        // Then extract the packet type
        Protocol::MQTT::V5::ControlPacketType type = impl->getLastPacketType();
        if (type == Protocol::MQTT::V5::CONNACK)
        {
            ErrorType ret = impl->handleConnACK();

            if (ret != ErrorType::Success)
                impl->close();
            return ret;
        }
#if MQTTUseAuth == 1
        else if (type == Protocol::MQTT::V5::AUTH)
        {
            // Authentication need to know if we are in a CONNECT/CONNACK process since it behaves differently in that case
            impl->setConnectionState(State::Authenticating);

            if (impl->handleAuth() == ErrorType::Success)
            { // We need to receive either a CONNACK or a AUTH packet now, so let's do that until we're done
                while (true)
                {
                    // Ok, now we have a packet read it
                    type = impl->getLastPacketType();
                    if (type == Protocol::MQTT::V5::CONNACK)
                    {
                        ErrorType ret = impl->handleConnACK();
                        if (ret != ErrorType::Success)
                            impl->close();

                        return ret;
                    }
                    else if (type == Protocol::MQTT::V5::AUTH)
                    {
                        if (ErrorType ret = impl->handleAuth())
                        {   // In case of authentication error, let's report back up
                            impl->close();
                            return ret;
                        }   // Else, let's continue the Authentication dance
                    }
                    else
                    {
                        impl->close();
                        return Protocol::MQTT::V5::ProtocolError;
                    }
                }
            }
        }
#endif
        // All other cases are error, let's close the connection now.
        impl->close();
        return Protocol::MQTT::V5::ProtocolError;
    }